

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# networkincludes.cpp
# Opt level: O1

zmsg_t * czhelp_zmsg_createv(char *picture,__va_list_tag *argptr)

{
  byte bVar1;
  uint uVar2;
  zmsg_t *self;
  zchunk_t *self_00;
  zuuid_t *self_01;
  zmsg_t *self_02;
  byte *pbVar3;
  undefined8 *puVar4;
  ushort *puVar5;
  uint *puVar6;
  int *piVar7;
  zframe_t *pzVar8;
  byte *data;
  size_t sVar9;
  ulong uVar10;
  char *format;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *data_00;
  void *pointer;
  undefined1 local_50 [32];
  
  self_02 = zmsg_new();
  do {
    bVar1 = *picture;
    if (bVar1 < 0x62) {
      switch(bVar1) {
      case 0x31:
        uVar2 = argptr->gp_offset;
        if ((ulong)uVar2 < 0x29) {
          pbVar3 = (byte *)((ulong)uVar2 + (long)argptr->reg_save_area);
          argptr->gp_offset = uVar2 + 8;
        }
        else {
          pbVar3 = (byte *)argptr->overflow_arg_area;
          argptr->overflow_arg_area = pbVar3 + 8;
        }
        uVar10 = (ulong)*pbVar3;
        break;
      case 0x32:
        uVar2 = argptr->gp_offset;
        if ((ulong)uVar2 < 0x29) {
          puVar5 = (ushort *)((ulong)uVar2 + (long)argptr->reg_save_area);
          argptr->gp_offset = uVar2 + 8;
        }
        else {
          puVar5 = (ushort *)argptr->overflow_arg_area;
          argptr->overflow_arg_area = puVar5 + 4;
        }
        uVar10 = (ulong)*puVar5;
        break;
      case 0x33:
      case 0x35:
      case 0x36:
      case 0x37:
        goto switchD_0017edec_caseD_65;
      case 0x34:
        uVar2 = argptr->gp_offset;
        if ((ulong)uVar2 < 0x29) {
          puVar6 = (uint *)((ulong)uVar2 + (long)argptr->reg_save_area);
          argptr->gp_offset = uVar2 + 8;
        }
        else {
          puVar6 = (uint *)argptr->overflow_arg_area;
          argptr->overflow_arg_area = puVar6 + 2;
        }
        uVar10 = (ulong)*puVar6;
        break;
      case 0x38:
        uVar2 = argptr->gp_offset;
        if ((ulong)uVar2 < 0x29) {
          puVar4 = (undefined8 *)((ulong)uVar2 + (long)argptr->reg_save_area);
          argptr->gp_offset = uVar2 + 8;
        }
        else {
          puVar4 = (undefined8 *)argptr->overflow_arg_area;
          argptr->overflow_arg_area = puVar4 + 1;
        }
        zmsg_addstrf(self_02,"%lu",*puVar4);
        goto LAB_0017f2a0;
      default:
        if (bVar1 == 0x55) {
          uVar2 = argptr->gp_offset;
          if ((ulong)uVar2 < 0x29) {
            puVar4 = (undefined8 *)((ulong)uVar2 + (long)argptr->reg_save_area);
            argptr->gp_offset = uVar2 + 8;
          }
          else {
            puVar4 = (undefined8 *)argptr->overflow_arg_area;
            argptr->overflow_arg_area = puVar4 + 1;
          }
          self_01 = (zuuid_t *)*puVar4;
          data = zuuid_data(self_01);
          sVar9 = zuuid_size(self_01);
          goto LAB_0017f291;
        }
        if (bVar1 == 0) {
          return self_02;
        }
        goto switchD_0017edec_caseD_65;
      }
      format = "%u";
LAB_0017f0ef:
      zmsg_addstrf(self_02,format,uVar10);
      goto LAB_0017f2a0;
    }
    switch(bVar1) {
    case 0x62:
      uVar2 = argptr->gp_offset;
      if ((ulong)uVar2 < 0x29) {
        puVar4 = (undefined8 *)((ulong)uVar2 + (long)argptr->reg_save_area);
        argptr->gp_offset = uVar2 + 8;
      }
      else {
        puVar4 = (undefined8 *)argptr->overflow_arg_area;
        argptr->overflow_arg_area = puVar4 + 1;
      }
      data_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)*puVar4;
      uVar2 = argptr->gp_offset;
      if ((ulong)uVar2 < 0x29) {
        piVar7 = (int *)((ulong)uVar2 + (long)argptr->reg_save_area);
        argptr->gp_offset = uVar2 + 8;
      }
      else {
        piVar7 = (int *)argptr->overflow_arg_area;
        argptr->overflow_arg_area = piVar7 + 2;
      }
      sVar9 = (size_t)*piVar7;
      goto LAB_0017f15a;
    case 99:
      uVar2 = argptr->gp_offset;
      if ((ulong)uVar2 < 0x29) {
        puVar4 = (undefined8 *)((ulong)uVar2 + (long)argptr->reg_save_area);
        argptr->gp_offset = uVar2 + 8;
      }
      else {
        puVar4 = (undefined8 *)argptr->overflow_arg_area;
        argptr->overflow_arg_area = puVar4 + 1;
      }
      self_00 = (zchunk_t *)*puVar4;
      data = zchunk_data(self_00);
      sVar9 = zchunk_size(self_00);
      goto LAB_0017f291;
    case 100:
      uVar2 = argptr->fp_offset;
      if ((ulong)uVar2 < 0xa1) {
        puVar4 = (undefined8 *)((ulong)uVar2 + (long)argptr->reg_save_area);
        argptr->fp_offset = uVar2 + 0x10;
      }
      else {
        puVar4 = (undefined8 *)argptr->overflow_arg_area;
        argptr->overflow_arg_area = puVar4 + 1;
      }
      __gnu_cxx::__to_xstring<std::__cxx11::string,char>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50,
                 vsnprintf,0x148,"%f",*puVar4);
      zmsg_addstr(self_02,(char *)local_50._0_8_);
      goto LAB_0017f234;
    default:
      goto switchD_0017edec_caseD_65;
    case 0x66:
      uVar2 = argptr->gp_offset;
      if ((ulong)uVar2 < 0x29) {
        puVar4 = (undefined8 *)((ulong)uVar2 + (long)argptr->reg_save_area);
        argptr->gp_offset = uVar2 + 8;
      }
      else {
        puVar4 = (undefined8 *)argptr->overflow_arg_area;
        argptr->overflow_arg_area = puVar4 + 1;
      }
      pzVar8 = (zframe_t *)*puVar4;
      data = zframe_data(pzVar8);
      sVar9 = zframe_size(pzVar8);
LAB_0017f291:
      zmsg_addmem(self_02,data,sVar9);
      break;
    case 0x68:
      uVar2 = argptr->gp_offset;
      if ((ulong)uVar2 < 0x29) {
        puVar4 = (undefined8 *)((ulong)uVar2 + (long)argptr->reg_save_area);
        argptr->gp_offset = uVar2 + 8;
      }
      else {
        puVar4 = (undefined8 *)argptr->overflow_arg_area;
        argptr->overflow_arg_area = puVar4 + 1;
      }
      local_50._0_8_ = zhashx_pack((zhashx_t *)*puVar4);
      zmsg_append(self_02,(zframe_t **)local_50);
      break;
    case 0x69:
      uVar2 = argptr->gp_offset;
      if ((ulong)uVar2 < 0x29) {
        puVar6 = (uint *)((ulong)uVar2 + (long)argptr->reg_save_area);
        argptr->gp_offset = uVar2 + 8;
      }
      else {
        puVar6 = (uint *)argptr->overflow_arg_area;
        argptr->overflow_arg_area = puVar6 + 2;
      }
      uVar10 = (ulong)*puVar6;
      format = "%d";
      goto LAB_0017f0ef;
    case 0x6d:
      uVar2 = argptr->gp_offset;
      if ((ulong)uVar2 < 0x29) {
        puVar4 = (undefined8 *)((ulong)uVar2 + (long)argptr->reg_save_area);
        argptr->gp_offset = uVar2 + 8;
      }
      else {
        puVar4 = (undefined8 *)argptr->overflow_arg_area;
        argptr->overflow_arg_area = puVar4 + 1;
      }
      self = (zmsg_t *)*puVar4;
      pzVar8 = zmsg_first(self);
      while (pzVar8 != (zframe_t *)0x0) {
        local_50._0_8_ = zframe_dup(pzVar8);
        zmsg_append(self_02,(zframe_t **)local_50);
        pzVar8 = zmsg_next(self);
      }
      break;
    case 0x6e:
      uVar2 = argptr->gp_offset;
      if ((ulong)uVar2 < 0x29) {
        puVar4 = (undefined8 *)((ulong)uVar2 + (long)argptr->reg_save_area);
        argptr->gp_offset = uVar2 + 8;
      }
      else {
        puVar4 = (undefined8 *)argptr->overflow_arg_area;
        argptr->overflow_arg_area = puVar4 + 1;
      }
      (**(code **)(*(long *)*puVar4 + 0x10))
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50);
      CZHelp::zmsg_addNDT(self_02,(binarydata *)local_50);
LAB_0017f234:
      if ((zframe_t *)local_50._0_8_ != (zframe_t *)(local_50 + 0x10)) {
        operator_delete((void *)local_50._0_8_,local_50._16_8_ + 1);
      }
      break;
    case 0x70:
      uVar2 = argptr->gp_offset;
      if ((ulong)uVar2 < 0x29) {
        puVar4 = (undefined8 *)((ulong)uVar2 + (long)argptr->reg_save_area);
        argptr->gp_offset = uVar2 + 8;
      }
      else {
        puVar4 = (undefined8 *)argptr->overflow_arg_area;
        argptr->overflow_arg_area = puVar4 + 1;
      }
      local_50._0_8_ = *puVar4;
      sVar9 = 8;
      data_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50;
      goto LAB_0017f15a;
    case 0x73:
      uVar2 = argptr->gp_offset;
      if ((ulong)uVar2 < 0x29) {
        puVar4 = (undefined8 *)((ulong)uVar2 + (long)argptr->reg_save_area);
        argptr->gp_offset = uVar2 + 8;
      }
      else {
        puVar4 = (undefined8 *)argptr->overflow_arg_area;
        argptr->overflow_arg_area = puVar4 + 1;
      }
      zmsg_addstr(self_02,(char *)*puVar4);
      break;
    case 0x75:
      uVar2 = argptr->gp_offset;
      if ((ulong)uVar2 < 0x29) {
        puVar6 = (uint *)((ulong)uVar2 + (long)argptr->reg_save_area);
        argptr->gp_offset = uVar2 + 8;
      }
      else {
        puVar6 = (uint *)argptr->overflow_arg_area;
        argptr->overflow_arg_area = puVar6 + 2;
      }
      uVar10 = (ulong)*puVar6;
      format = "%ud";
      goto LAB_0017f0ef;
    case 0x7a:
      sVar9 = 0;
      data_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
LAB_0017f15a:
      zmsg_addmem(self_02,data_00,sVar9);
    }
LAB_0017f2a0:
    picture = (char *)((byte *)picture + 1);
  } while( true );
switchD_0017edec_caseD_65:
  zsys_error("zsock: invalid picture element \'%c\'");
  goto LAB_0017f2a0;
}

Assistant:

zmsg_t* czhelp_zmsg_createv(const char *picture, va_list argptr){
    zmsg_t *msg = zmsg_new ();
    while (*picture) {
//        std::cerr << picture << "\n";
        if (*picture == 'i')
            zmsg_addstrf (msg, "%d", va_arg (argptr, int));
        else if (*picture == '1')
            zmsg_addstrf (msg, "%" PRIu8, (uint8_t) va_arg (argptr, int));
        else if (*picture == '2')
            zmsg_addstrf (msg, "%" PRIu16, (uint16_t) va_arg (argptr, int));
        else if (*picture == '4')
            zmsg_addstrf (msg, "%" PRIu32, va_arg (argptr, uint32_t));
        else if (*picture == '8')
            zmsg_addstrf (msg, "%" PRIu64, va_arg (argptr, uint64_t));
        else if (*picture == 'u')    //  Deprecated, use 4 or 8 instead
            zmsg_addstrf (msg, "%ud", va_arg (argptr, uint));
        else if (*picture == 'd')
            zmsg_addstr (msg, std::to_string(va_arg (argptr, double)).c_str());
        else if (*picture == 's') {
            char *str = va_arg(argptr, char *);
            zmsg_addstr (msg, str);
        }
        else if (*picture == 'b') {
            //  Note function arguments may be expanded in reverse order,
            //  so we cannot use va_arg macro twice in a single call
            byte *data = va_arg (argptr, byte *);
            zmsg_addmem (msg, data, va_arg (argptr, int));
        }
        else if (*picture == 'c') {
            zchunk_t *chunk = va_arg (argptr, zchunk_t *);
            assert (zchunk_is (chunk));
            zmsg_addmem (msg, zchunk_data (chunk), zchunk_size (chunk));
        }
        else if (*picture == 'f') {
            zframe_t *frame = va_arg (argptr, zframe_t *);
            assert (zframe_is (frame));
            zmsg_addmem (msg, zframe_data (frame), zframe_size (frame));
        }
        else if (*picture == 'U') {
            zuuid_t *uuid = va_arg (argptr, zuuid_t *);
            zmsg_addmem (msg, zuuid_data (uuid), zuuid_size (uuid));
        }
        else if (*picture == 'p') {
            void *pointer = va_arg (argptr, void *);
            zmsg_addmem (msg, &pointer, sizeof (void *));
        }
        else if (*picture == 'h') {
            zhashx_t *hash = va_arg (argptr, zhashx_t *);
            zframe_t *frame = zhashx_pack (hash);
            zmsg_append (msg, &frame);
        }
        else if (*picture == 'm') {
            zframe_t *frame;
            zmsg_t *zmsg = va_arg (argptr, zmsg_t *);
            for (frame = zmsg_first (zmsg); frame;
                    frame = zmsg_next (zmsg) ) {
                zframe_t *frame_dup = zframe_dup (frame);
                zmsg_append (msg, &frame_dup);
            }
        }
        else if (*picture == 'n') {
            NetworkDataType *val = va_arg(argptr, NetworkDataType *);
            binarydata dat = val->encode();
            CZHelp::zmsg_addNDT(msg, dat);
        }
        else if (*picture == 'z')
            zmsg_addmem (msg, NULL, 0);
        else {
            zsys_error ("zsock: invalid picture element '%c'", *picture);
            assert (false);
        }
        picture++;
    }
    return msg;
}